

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TennisTest.cpp
# Opt level: O1

void __thiscall
TennisTest_ScoresAreZeroAtStart_Test::TestBody(TennisTest_ScoresAreZeroAtStart_Test *this)

{
  bool bVar1;
  char *message;
  undefined1 local_58 [8];
  string score;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Tennis local_11 [8];
  Tennis t1;
  
  Tennis::score_abi_cxx11_((string *)local_58,local_11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[30]>
            ((internal *)(score.field_2._M_local_buf + 8),"score",
             "\"Player 1: love Player 2: love\"",(string *)local_58,
             (char (*) [30])"Player 1: love Player 2: love");
  if (score.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/test/TennisTest.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (undefined1  [8])&score._M_string_length) {
    operator_delete((void *)local_58,score._M_string_length + 1);
  }
  return;
}

Assistant:

TEST(TennisTest, ScoresAreZeroAtStart)
{
    //Setup
    Tennis t1;

    //Execute
    std::string score = t1.score();

    //Verify
    //Zero points are called "love" in a Tennis game
    ASSERT_EQ(score, "Player 1: love Player 2: love");
}